

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall CClient::RegisterCommands(CClient *this)

{
  IConsole *pIVar1;
  IInterface *in_RDI;
  
  IInterface::Kernel(in_RDI);
  pIVar1 = IKernel::RequestInterface<IConsole>((IKernel *)in_RDI);
  in_RDI[9].m_pKernel = (IKernel *)pIVar1;
  (*(in_RDI[9].m_pKernel)->_vptr_IKernel[8])
            (in_RDI[9].m_pKernel,"quit","",10,Con_Quit,in_RDI,"Quit Teeworlds");
  (*(in_RDI[9].m_pKernel)->_vptr_IKernel[8])
            (in_RDI[9].m_pKernel,"exit","",10,Con_Quit,in_RDI,"Quit Teeworlds");
  (*(in_RDI[9].m_pKernel)->_vptr_IKernel[8])
            (in_RDI[9].m_pKernel,"minimize","",10,Con_Minimize,in_RDI,"Minimize Teeworlds");
  (*(in_RDI[9].m_pKernel)->_vptr_IKernel[8])
            (in_RDI[9].m_pKernel,"connect","s[host|ip]",10,Con_Connect,in_RDI,
             "Connect to the specified host/ip");
  (*(in_RDI[9].m_pKernel)->_vptr_IKernel[8])
            (in_RDI[9].m_pKernel,"disconnect","",2,Con_Disconnect,in_RDI,
             "Disconnect from the server");
  (*(in_RDI[9].m_pKernel)->_vptr_IKernel[8])
            (in_RDI[9].m_pKernel,"ping","",2,Con_Ping,in_RDI,"Ping the current server");
  (*(in_RDI[9].m_pKernel)->_vptr_IKernel[8])
            (in_RDI[9].m_pKernel,"screenshot","",2,Con_Screenshot,in_RDI,"Take a screenshot");
  (*(in_RDI[9].m_pKernel)->_vptr_IKernel[8])
            (in_RDI[9].m_pKernel,"rcon","r[command]",2,Con_Rcon,in_RDI,
             "Send specified command to rcon");
  (*(in_RDI[9].m_pKernel)->_vptr_IKernel[8])
            (in_RDI[9].m_pKernel,"rcon_auth","s[password]",2,Con_RconAuth,in_RDI,
             "Authenticate to rcon");
  (*(in_RDI[9].m_pKernel)->_vptr_IKernel[8])
            (in_RDI[9].m_pKernel,"record","?s[file]",2,Con_Record,in_RDI,"Record to the file");
  (*(in_RDI[9].m_pKernel)->_vptr_IKernel[8])
            (in_RDI[9].m_pKernel,"stoprecord","",2,Con_StopRecord,in_RDI,"Stop recording");
  (*(in_RDI[9].m_pKernel)->_vptr_IKernel[8])
            (in_RDI[9].m_pKernel,"add_demomarker","",2,Con_AddDemoMarker,in_RDI,
             "Add demo timeline marker");
  (*(in_RDI[9].m_pKernel)->_vptr_IKernel[0xf])
            (in_RDI[9].m_pKernel,"br_filter_string",ConchainServerBrowserUpdate);
  (*(in_RDI[9].m_pKernel)->_vptr_IKernel[0xf])
            (in_RDI[9].m_pKernel,"gfx_screen",ConchainWindowScreen);
  (*(in_RDI[9].m_pKernel)->_vptr_IKernel[0xf])
            (in_RDI[9].m_pKernel,"gfx_fullscreen",ConchainFullscreen);
  (*(in_RDI[9].m_pKernel)->_vptr_IKernel[0xf])
            (in_RDI[9].m_pKernel,"gfx_borderless",ConchainWindowBordered);
  (*(in_RDI[9].m_pKernel)->_vptr_IKernel[0xf])(in_RDI[9].m_pKernel,"gfx_vsync",ConchainWindowVSync);
  return;
}

Assistant:

void CClient::RegisterCommands()
{
	m_pConsole = Kernel()->RequestInterface<IConsole>();

	m_pConsole->Register("quit", "", CFGFLAG_CLIENT|CFGFLAG_STORE, Con_Quit, this, "Quit Teeworlds");
	m_pConsole->Register("exit", "", CFGFLAG_CLIENT|CFGFLAG_STORE, Con_Quit, this, "Quit Teeworlds");
	m_pConsole->Register("minimize", "", CFGFLAG_CLIENT|CFGFLAG_STORE, Con_Minimize, this, "Minimize Teeworlds");
	m_pConsole->Register("connect", "s[host|ip]", CFGFLAG_CLIENT|CFGFLAG_STORE, Con_Connect, this, "Connect to the specified host/ip");
	m_pConsole->Register("disconnect", "", CFGFLAG_CLIENT, Con_Disconnect, this, "Disconnect from the server");
	m_pConsole->Register("ping", "", CFGFLAG_CLIENT, Con_Ping, this, "Ping the current server");
	m_pConsole->Register("screenshot", "", CFGFLAG_CLIENT, Con_Screenshot, this, "Take a screenshot");
	m_pConsole->Register("rcon", "r[command]", CFGFLAG_CLIENT, Con_Rcon, this, "Send specified command to rcon");
	m_pConsole->Register("rcon_auth", "s[password]", CFGFLAG_CLIENT, Con_RconAuth, this, "Authenticate to rcon");
	m_pConsole->Register("record", "?s[file]", CFGFLAG_CLIENT, Con_Record, this, "Record to the file");
	m_pConsole->Register("stoprecord", "", CFGFLAG_CLIENT, Con_StopRecord, this, "Stop recording");
	m_pConsole->Register("add_demomarker", "", CFGFLAG_CLIENT, Con_AddDemoMarker, this, "Add demo timeline marker");

	// used for server browser update
	m_pConsole->Chain("br_filter_string", ConchainServerBrowserUpdate, this);

	m_pConsole->Chain("gfx_screen", ConchainWindowScreen, this);
	m_pConsole->Chain("gfx_fullscreen", ConchainFullscreen, this);
	m_pConsole->Chain("gfx_borderless", ConchainWindowBordered, this);
	m_pConsole->Chain("gfx_vsync", ConchainWindowVSync, this);
}